

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O2

SubscriptionSync * __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::CreateSubscriptionSync
          (SubscriptionSync *__return_storage_ptr__,SubjectSetRegister *this,int edition,
          vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
          *subject_set)

{
  SubscriptionSync subscription_sync;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_a0;
  SubscriptionSync local_88;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_a0,subject_set);
  SubscriptionSync::SubscriptionSync(&local_88,edition,&local_a0);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_a0);
  AddSubscriptionControls(this,&local_88);
  SubscriptionSync::SubscriptionSync(__return_storage_ptr__,&local_88);
  SubscriptionSync::~SubscriptionSync(&local_88);
  return __return_storage_ptr__;
}

Assistant:

SubscriptionSync SubjectSetRegister::CreateSubscriptionSync(int edition, std::vector<Subject>& subject_set)
{
    SubscriptionSync subscription_sync(edition, subject_set);
    AddSubscriptionControls(subscription_sync);
    return std::move(subscription_sync);
}